

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetFirst(Cluster *this,BlockEntry **pFirst)

{
  long lVar1;
  undefined8 *in_RSI;
  long in_RDI;
  long status;
  long len;
  longlong pos;
  long *in_stack_00000058;
  longlong *in_stack_00000060;
  Cluster *in_stack_00000068;
  
  if (*(long *)(in_RDI + 0x40) < 1) {
    lVar1 = Parse(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (lVar1 < 0) {
      *in_RSI = 0;
      return lVar1;
    }
    if (*(long *)(in_RDI + 0x40) < 1) {
      *in_RSI = 0;
      return 0;
    }
  }
  *in_RSI = **(undefined8 **)(in_RDI + 0x30);
  return 0;
}

Assistant:

long Cluster::GetFirst(const BlockEntry*& pFirst) const {
  if (m_entries_count <= 0) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pFirst = NULL;
      return status;
    }

    if (m_entries_count <= 0) {  // empty cluster
      pFirst = NULL;
      return 0;
    }
  }

  assert(m_entries);

  pFirst = m_entries[0];
  assert(pFirst);

  return 0;  // success
}